

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

ZSTD_DCtx * ZSTD_createDCtx_internal(ZSTD_customMem customMem)

{
  ZSTD_DCtx *dctx;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  
  if ((in_stack_00000010 == (ZSTD_freeFunction)0x0) ==
      (in_stack_00000008 == (ZSTD_allocFunction)0x0)) {
    if (in_stack_00000008 == (ZSTD_allocFunction)0x0) {
      dctx = (ZSTD_DCtx *)malloc(0x176e0);
    }
    else {
      dctx = (ZSTD_DCtx *)(*in_stack_00000008)(in_stack_00000018,0x176e0);
    }
    if (dctx != (ZSTD_DCtx *)0x0) {
      (dctx->customMem).opaque = in_stack_00000018;
      (dctx->customMem).customAlloc = in_stack_00000008;
      (dctx->customMem).customFree = in_stack_00000010;
      dctx->dictEnd = (void *)0x0;
      dctx->ddictIsCold = 0;
      dctx->dictUses = ZSTD_dont_use;
      dctx->outBuffSize = 0;
      dctx->streamStage = zdss_init;
      dctx->noForwardProgress = 0;
      dctx->oversizedDuration = 0;
      dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
      dctx->staticSize = 0;
      dctx->ddictLocal = (ZSTD_DDict *)0x0;
      dctx->ddict = (ZSTD_DDict *)0x0;
      dctx->inBuff = (char *)0x0;
      dctx->inBuffSize = 0;
      ZSTD_DCtx_resetParameters(dctx);
      return dctx;
    }
  }
  return (ZSTD_DCtx *)0x0;
}

Assistant:

static ZSTD_DCtx* ZSTD_createDCtx_internal(ZSTD_customMem customMem) {
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DCtx* const dctx = (ZSTD_DCtx*)ZSTD_customMalloc(sizeof(*dctx), customMem);
        if (!dctx) return NULL;
        dctx->customMem = customMem;
        ZSTD_initDCtx_internal(dctx);
        return dctx;
    }
}